

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O1

LY_ERR lyds_insert2(lyd_node *parent,lyd_node **first_sibling,lyd_node **leader,lyd_node *node,
                   lyds_pool *pool)

{
  lyd_meta *plVar1;
  lyd_node *plVar2;
  rb_node **pprVar3;
  rb_node **pprVar4;
  LY_ERR ret___1;
  LY_ERR LVar5;
  rb_node *prVar6;
  LY_ERR ret__;
  lyd_node *node_00;
  lyd_meta **meta;
  rb_node **next_state;
  rb_node *rbt;
  lyd_meta *root_meta;
  rb_node *rbn;
  lyd_node *ld;
  rb_node *local_70;
  lyd_meta *local_68;
  undefined4 local_5c;
  rb_node *local_58;
  rb_node **local_50;
  lyd_meta *local_48;
  lyd_node *local_40;
  lyd_node *local_38;
  
  local_70 = (rb_node *)0x0;
  if ((((pool == (lyds_pool *)0x0) || (node == (lyd_node *)0x0)) ||
      (first_sibling == (lyd_node **)0x0)) || (pool->rbn == (rb_node *)0x0)) {
    __assert_fail("pool && pool->rbn && first_sibling && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x4f0,
                  "LY_ERR lyds_insert2(struct lyd_node *, struct lyd_node **, struct lyd_node **, struct lyd_node *, struct lyds_pool *)"
                 );
  }
  if ((*leader == (lyd_node *)0x0) || ((*leader)->schema != node->schema)) {
    local_38 = (lyd_node *)0x0;
    lyd_find_sibling_schema(*first_sibling,node->schema,&local_38);
    if (local_38 == (lyd_node *)0x0) {
      lyd_insert_node_ordby_schema(parent,first_sibling,node);
      *leader = node;
      goto LAB_00157530;
    }
    *leader = local_38;
  }
  meta = &local_68;
  prVar6 = lyds_get_rb_tree(*leader,meta);
  local_70 = prVar6;
  if (local_68 == (lyd_meta *)0x0) {
    local_68 = pool->meta;
    if (local_68 == (lyd_meta *)0x0) {
      local_68 = (lyd_meta *)0x0;
    }
    else {
      plVar1 = local_68->next;
      local_68->next = (lyd_meta *)0x0;
      pool->meta = plVar1;
    }
    if (local_68 == (lyd_meta *)0x0) {
      LVar5 = lyds_create_metadata(*leader,&local_68);
      meta = (lyd_meta **)(ulong)LVar5;
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
    }
    else {
      lyd_insert_meta(*leader,local_68,'\0');
    }
  }
  if (prVar6 == (rb_node *)0x0) {
    local_48 = local_68;
    prVar6 = pool->rbn;
    prVar6->right = (rb_node *)0x0;
    prVar6->dnode = (lyd_node *)0x0;
    prVar6->parent = (rb_node *)0x0;
    prVar6->left = (rb_node *)0x0;
    *(undefined8 *)&prVar6->color = 0;
    local_70 = pool->rbn;
    local_70->dnode = *leader;
    next_state = &pool->iter_state;
    local_5c = (int)meta;
    prVar6 = rb_iter_traversal(pool->iter_state,next_state);
    pool->rbn = prVar6;
    pprVar4 = next_state;
    node_00 = (*leader)->next;
    pprVar3 = local_50;
    while ((local_50 = pprVar4, node_00 != (lyd_node *)0x0 &&
           (pprVar3 = local_50, local_40 = node, node_00->schema == (*leader)->schema))) {
      prVar6 = pool->rbn;
      if (prVar6 == (rb_node *)0x0) goto LAB_0015767e;
      plVar2 = node_00->next;
      prVar6->right = (rb_node *)0x0;
      prVar6->dnode = (lyd_node *)0x0;
      prVar6->parent = (rb_node *)0x0;
      prVar6->left = (rb_node *)0x0;
      *(undefined8 *)&prVar6->color = 0;
      prVar6 = pool->rbn;
      prVar6->dnode = node_00;
      rb_insert_node(&local_70,prVar6,(ly_bool *)&local_58);
      if ((char)local_58 == '\0') {
        lyd_unlink_ignore_lyds(first_sibling,node_00);
        next_state = local_50;
        lyds_link_data_node(first_sibling,leader,node_00,local_48,pool->rbn);
        lyd_insert_hash(node_00);
      }
      prVar6 = rb_iter_traversal(pool->iter_state,next_state);
      pool->rbn = prVar6;
      pprVar4 = local_50;
      node_00 = plVar2;
      node = local_40;
      pprVar3 = local_50;
    }
    local_50 = pprVar3;
    node_00 = (lyd_node *)0x0;
LAB_0015767e:
    if ((node_00 != (lyd_node *)0x0) &&
       (LVar5 = lyds_additionally_create_rb_nodes(first_sibling,leader,local_68,&local_70,node_00),
       LVar5 != LY_SUCCESS)) {
      return LVar5;
    }
  }
  prVar6 = pool->rbn;
  if (prVar6 == (rb_node *)0x0) {
    LVar5 = rb_insert(node,&local_70,&local_58);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
  }
  else {
    prVar6->right = (rb_node *)0x0;
    prVar6->dnode = (lyd_node *)0x0;
    prVar6->parent = (rb_node *)0x0;
    prVar6->left = (rb_node *)0x0;
    *(undefined8 *)&prVar6->color = 0;
    prVar6->dnode = node;
    local_58 = prVar6;
    rb_insert_node(&local_70,prVar6,(ly_bool *)0x0);
    prVar6 = rb_iter_traversal(pool->iter_state,&pool->iter_state);
    pool->rbn = prVar6;
  }
  lyds_link_data_node(first_sibling,leader,node,local_68,local_58);
LAB_00157530:
  if (local_70 != (rb_node *)0x0) {
    (local_68->value).field_2.dec64 = (int64_t)local_70;
  }
  lyd_insert_hash(node);
  if (node->prev->next != (lyd_node *)0x0) {
    node = *first_sibling;
  }
  *first_sibling = node;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyds_insert2(struct lyd_node *parent, struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_node *node, struct lyds_pool *pool)
{
    LY_ERR ret;
    struct rb_node *rbt = NULL, *rbn;
    struct lyd_node *ld, *next;
    struct lyd_meta *root_meta;

    assert(pool && pool->rbn && first_sibling && node);

    if (!*leader || ((*leader)->schema != node->schema)) {
        /* leader has not been visited yet */
        ld = NULL;
        lyd_find_sibling_schema(*first_sibling, node->schema, &ld);
        if (!ld) {
            /* the destination has no (leaf-)list instance yet. */
            lyd_insert_node_ordby_schema(parent, first_sibling, node);
            *leader = node;
            goto cleanup;
        } else {
            /* leader has been found */
            *leader = ld;
        }
    }

    /* get Red-black tree from leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);
    if (!root_meta) {
        /* leader needs metadata */
        root_meta = lyds_pool_get_meta(pool);
        if (!root_meta) {
            /* there is no free structure for metadata, a new one must be allocated */
            ret = lyds_create_metadata(*leader, &root_meta);
            LY_CHECK_RET(ret);
        } else {
            /* reuse metadata */
            lyd_insert_meta(*leader, root_meta, 0);
        }
    }
    if (!rbt) {
        /* Red-black tree needed */
        lyds_additionally_reuse_rb_tree(first_sibling, leader, root_meta, &rbt, pool, &next);
        if (next) {
            /* there is no free structure for red-black node, a new ones must be allocated */
            ret = lyds_additionally_create_rb_nodes(first_sibling, leader, root_meta, &rbt, next);
            LY_CHECK_RET(ret);
        }
    }

    /* insert @p node */
    if (pool->rbn) {
        /* reuse free red-black node and insert */
        rbn = pool->rbn;
        RBN_RESET(rbn, node);
        rb_insert_node(&rbt, rbn, NULL);
        /* prepare for the next node */
        pool->rbn = rb_iter_next(&pool->iter_state);
    } else {
        /* allocate new node and insert */
        ret = rb_insert(node, &rbt, &rbn);
        LY_CHECK_RET(ret);
    }
    /* connect @p node with siblings so that the order is maintained */
    lyds_link_data_node(first_sibling, leader, node, root_meta, rbn);

cleanup:
    if (rbt) {
        RBT_SET(root_meta, rbt);
    }
    lyd_insert_hash(node);
    *first_sibling = node->prev->next ? *first_sibling : node;

    return LY_SUCCESS;
}